

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeType(WasmBinaryWriter *this,Type type)

{
  bool bVar1;
  Shareability share;
  BasicHeapType BVar2;
  BasicType BVar3;
  Exactness exactness;
  HeapType HVar4;
  S32LEB x;
  BufferWithRandomAccess *this_00;
  char *__assertion;
  HeapType local_40;
  Type local_38;
  HeapType local_30;
  HeapType heapType;
  
  heapType.id = type.id;
  if ((type.id & 1) != 0 || type.id < 7) {
    if ((type.id & 1) != 0 && 6 < type.id) {
      __assertion = "!type.isTuple() && \"Unexpected tuple type\"";
LAB_00cbf9ee:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x674,"void wasm::WasmBinaryWriter::writeType(Type)");
    }
    if (6 < type.id) {
      __assertion = "type.isBasic() && \"TODO: handle compound types\"";
      goto LAB_00cbf9ee;
    }
    BVar3 = wasm::Type::getBasic((Type *)&heapType);
    if ((v128 < BVar3) || ((0x7dU >> (BVar3 & 0x1f) & 1) == 0)) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                         ,0x68a);
    }
    x.value = *(int *)(&DAT_00e54630 + (ulong)BVar3 * 4);
    this_00 = this->o;
    goto LAB_00cbf85a;
  }
  if (((this->wasm->features).features & 0x400) == 0) {
    local_30 = wasm::Type::getHeapType((Type *)&heapType);
    bVar1 = HeapType::isMaybeShared(&local_30,string);
    if (bVar1) {
      share = HeapType::getShared(&local_30);
      BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::string,share);
    }
    else {
      local_40 = wasm::Type::getHeapType((Type *)&heapType);
      BVar2 = HeapType::getTop(&local_40);
    }
    HVar4.id._4_4_ = 0;
    HVar4.id._0_4_ = BVar2;
    wasm::Type::Type(&local_38,HVar4,Nullable,Inexact);
    heapType.id = local_38.id;
  }
  local_30 = wasm::Type::getHeapType((Type *)&heapType);
  if (((0x7c < local_30.id || heapType.id < 7) || ((uint)heapType.id & 3) != 2) ||
     (bVar1 = HeapType::isShared(&local_30), bVar1)) {
switchD_00cbf948_default:
    BufferWithRandomAccess::operator<<
              (this->o,(S32LEB)(-0x1c - (uint)(((uint)heapType.id & 3) == 2 && 6 < heapType.id)));
    HVar4 = wasm::Type::getHeapType((Type *)&heapType);
    exactness = wasm::Type::getExactness((Type *)&heapType);
    writeHeapType(this,HVar4,exactness);
  }
  else {
    BVar2 = HeapType::getBasic(&local_30,Unshared);
    switch(BVar2 << 0x1d | BVar2 - ext >> 3) {
    case 0:
      this_00 = this->o;
      x.value = -0x11;
      break;
    case 1:
      this_00 = this->o;
      x.value = -0x10;
      break;
    case 2:
      this_00 = this->o;
      x.value = -0x18;
      break;
    case 3:
      this_00 = this->o;
      x.value = -0x12;
      break;
    case 4:
      this_00 = this->o;
      x.value = -0x13;
      break;
    case 5:
      this_00 = this->o;
      x.value = -0x14;
      break;
    case 6:
      this_00 = this->o;
      x.value = -0x15;
      break;
    case 7:
      this_00 = this->o;
      x.value = -0x16;
      break;
    case ext:
      this_00 = this->o;
      x.value = -0x17;
      break;
    case 9:
      this_00 = this->o;
      x.value = -0x19;
      break;
    case 10:
      this_00 = this->o;
      x.value = -0xf;
      break;
    case 0xb:
      this_00 = this->o;
      x.value = -0xe;
      break;
    case 0xc:
      this_00 = this->o;
      x.value = -0xd;
      break;
    case 0xd:
      this_00 = this->o;
      x.value = -0xb;
      break;
    case 0xe:
      this_00 = this->o;
      x.value = -0xc;
      break;
    default:
      goto switchD_00cbf948_default;
    }
LAB_00cbf85a:
    BufferWithRandomAccess::operator<<(this_00,x);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeType(Type type) {
  if (type.isRef()) {
    // The only reference types allowed without GC are funcref, externref, and
    // exnref. We internally use more refined versions of those types, but we
    // cannot emit those without GC.
    if (!wasm->features.hasGC()) {
      auto ht = type.getHeapType();
      if (ht.isMaybeShared(HeapType::string)) {
        // Do not overgeneralize stringref to anyref. We have tests that when a
        // stringref is expected, we actually get a stringref. If we see a
        // string, the stringref feature must be enabled.
        type = Type(HeapTypes::string.getBasic(ht.getShared()), Nullable);
      } else {
        // Only the top type (func, extern, exn) is available, and only the
        // nullable version.
        type = Type(type.getHeapType().getTop(), Nullable);
      }
    }
    auto heapType = type.getHeapType();
    if (type.isNullable() && heapType.isBasic() && !heapType.isShared()) {
      switch (heapType.getBasic(Unshared)) {
        case HeapType::ext:
          o << S32LEB(BinaryConsts::EncodedType::externref);
          return;
        case HeapType::any:
          o << S32LEB(BinaryConsts::EncodedType::anyref);
          return;
        case HeapType::func:
          o << S32LEB(BinaryConsts::EncodedType::funcref);
          return;
        case HeapType::cont:
          o << S32LEB(BinaryConsts::EncodedType::contref);
          return;
        case HeapType::eq:
          o << S32LEB(BinaryConsts::EncodedType::eqref);
          return;
        case HeapType::i31:
          o << S32LEB(BinaryConsts::EncodedType::i31ref);
          return;
        case HeapType::struct_:
          o << S32LEB(BinaryConsts::EncodedType::structref);
          return;
        case HeapType::array:
          o << S32LEB(BinaryConsts::EncodedType::arrayref);
          return;
        case HeapType::exn:
          o << S32LEB(BinaryConsts::EncodedType::exnref);
          return;
        case HeapType::string:
          o << S32LEB(BinaryConsts::EncodedType::stringref);
          return;
        case HeapType::none:
          o << S32LEB(BinaryConsts::EncodedType::nullref);
          return;
        case HeapType::noext:
          o << S32LEB(BinaryConsts::EncodedType::nullexternref);
          return;
        case HeapType::nofunc:
          o << S32LEB(BinaryConsts::EncodedType::nullfuncref);
          return;
        case HeapType::noexn:
          o << S32LEB(BinaryConsts::EncodedType::nullexnref);
          return;
        case HeapType::nocont:
          o << S32LEB(BinaryConsts::EncodedType::nullcontref);
          return;
      }
    }
    if (type.isNullable()) {
      o << S32LEB(BinaryConsts::EncodedType::nullable);
    } else {
      o << S32LEB(BinaryConsts::EncodedType::nonnullable);
    }
    writeHeapType(type.getHeapType(), type.getExactness());
    return;
  }
  int ret = 0;
  TODO_SINGLE_COMPOUND(type);
  switch (type.getBasic()) {
    // None only used for block signatures. TODO: Separate out?
    case Type::none:
      ret = BinaryConsts::EncodedType::Empty;
      break;
    case Type::i32:
      ret = BinaryConsts::EncodedType::i32;
      break;
    case Type::i64:
      ret = BinaryConsts::EncodedType::i64;
      break;
    case Type::f32:
      ret = BinaryConsts::EncodedType::f32;
      break;
    case Type::f64:
      ret = BinaryConsts::EncodedType::f64;
      break;
    case Type::v128:
      ret = BinaryConsts::EncodedType::v128;
      break;
    default:
      WASM_UNREACHABLE("unexpected type");
  }
  o << S32LEB(ret);
}